

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderTextureSizeTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureSizeCase::init
          (TextureSizeCase *this,EVP_PKEY_CTX *ctx)

{
  _Rb_tree_header *p_Var1;
  code *pcVar2;
  Context *pCVar3;
  RenderContext *renderCtx;
  bool bVar4;
  int iVar5;
  ContextType CVar6;
  GLenum GVar7;
  GLenum GVar8;
  GLSLVersion GVar9;
  undefined4 extraout_var;
  RenderTarget *pRVar10;
  ShaderProgram *this_00;
  mapped_type *pmVar11;
  ProgramSources *pPVar12;
  reference pvVar13;
  NotSupportedError *this_01;
  TestError *this_02;
  int ndx;
  long lVar14;
  string sStack_2c8;
  GLint maxTextureSize;
  allocator<char> local_29d;
  GLint maxTextureLayers;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  specializationMap;
  string local_268;
  undefined1 local_248 [44];
  GLint maxSamples;
  string local_218;
  string local_1f8;
  undefined1 local_1d8 [40];
  undefined1 local_1b0 [8];
  int local_1a8;
  pointer local_100;
  undefined1 uStack_f8;
  undefined7 uStack_f7;
  undefined1 uStack_f0;
  undefined8 uStack_ef;
  
  if ((Functional::(anonymous_namespace)::TextureSizeCase::init()::testSizes2D == '\0') &&
     (iVar5 = __cxa_guard_acquire(&Functional::(anonymous_namespace)::TextureSizeCase::init()::
                                   testSizes2D), iVar5 != 0)) {
    init::testSizes2D[0].m_data = (int  [2])&DAT_100000001;
    init::testSizes2D[1].m_data[0] = 1;
    init::testSizes2D[1].m_data[1] = 4;
    init::testSizes2D[2].m_data[0] = 4;
    init::testSizes2D[2].m_data[1] = 8;
    init::testSizes2D[3].m_data[0] = 0x15;
    init::testSizes2D[3].m_data[1] = 0xb;
    init::testSizes2D[4].m_data[0] = 0x6b;
    init::testSizes2D[4].m_data[1] = 0xfe;
    init::testSizes2D[5].m_data[0] = -1;
    init::testSizes2D[5].m_data[1] = 3;
    init::testSizes2D[6].m_data[0] = 3;
    init::testSizes2D[6].m_data[1] = -1;
    __cxa_guard_release(&Functional::(anonymous_namespace)::TextureSizeCase::init()::testSizes2D);
  }
  if ((Functional::(anonymous_namespace)::TextureSizeCase::init()::testSizes3D == '\0') &&
     (iVar5 = __cxa_guard_acquire(&Functional::(anonymous_namespace)::TextureSizeCase::init()::
                                   testSizes3D), iVar5 != 0)) {
    init::testSizes3D[0].m_data._0_8_ = &DAT_100000001;
    init::testSizes3D._8_8_ = &DAT_100000001;
    init::testSizes3D[1].m_data[1] = 4;
    init::testSizes3D[1].m_data[2] = 7;
    init::testSizes3D[2].m_data[0] = 4;
    init::testSizes3D[2].m_data[1] = 8;
    init::testSizes3D[2].m_data[2] = 0xc;
    init::testSizes3D[3].m_data[0] = 0x15;
    init::testSizes3D[3].m_data[1] = 0xb;
    init::testSizes3D[3].m_data[2] = 9;
    init::testSizes3D[4].m_data[0] = 0x6b;
    init::testSizes3D[4].m_data[1] = 0xfe;
    init::testSizes3D[4].m_data[2] = 2;
    init::testSizes3D[5].m_data[0] = -1;
    init::testSizes3D[5].m_data[1] = 3;
    init::testSizes3D[5].m_data[2] = 3;
    init::testSizes3D[6].m_data[0] = 3;
    init::testSizes3D[6].m_data[1] = -1;
    init::testSizes3D[6].m_data[2] = 3;
    init::testSizes3D[7].m_data[0] = 4;
    init::testSizes3D[7].m_data[1] = 4;
    init::testSizes3D[7].m_data[2] = -1;
    __cxa_guard_release(&Functional::(anonymous_namespace)::TextureSizeCase::init()::testSizes3D);
  }
  if ((Functional::(anonymous_namespace)::TextureSizeCase::init()::fullscreenQuad == '\0') &&
     (iVar5 = __cxa_guard_acquire(&Functional::(anonymous_namespace)::TextureSizeCase::init()::
                                   fullscreenQuad), iVar5 != 0)) {
    init::fullscreenQuad[0].m_data[0] = _DAT_0167baf0;
    init::fullscreenQuad[0].m_data[1] = _UNK_0167baf4;
    init::fullscreenQuad[0].m_data[2] = _UNK_0167baf8;
    init::fullscreenQuad[0].m_data[3] = _UNK_0167bafc;
    init::fullscreenQuad[1].m_data[0] = _DAT_0167bb00;
    init::fullscreenQuad[1].m_data[1] = _UNK_0167bb04;
    init::fullscreenQuad[1].m_data[2] = _UNK_0167bb08;
    init::fullscreenQuad[1].m_data[3] = _UNK_0167bb0c;
    init::fullscreenQuad[2].m_data[0] = _DAT_0167bb10;
    init::fullscreenQuad[2].m_data[1] = _UNK_0167bb14;
    init::fullscreenQuad[2].m_data[2] = _UNK_0167bb18;
    init::fullscreenQuad[2].m_data[3] = _UNK_0167bb1c;
    init::fullscreenQuad[3].m_data[0] = _DAT_0167bb20;
    init::fullscreenQuad[3].m_data[1] = _UNK_0167bb24;
    init::fullscreenQuad[3].m_data[2] = _UNK_0167bb28;
    init::fullscreenQuad[3].m_data[3] = _UNK_0167bb2c;
    __cxa_guard_release(&Functional::(anonymous_namespace)::TextureSizeCase::init()::fullscreenQuad)
    ;
  }
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar14 = CONCAT44(extraout_var,iVar5);
  CVar6.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar4 = glu::contextSupports(CVar6,(ApiType)0x23);
  if (((!bVar4) && (this->m_isArrayType != false)) &&
     (bVar4 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,
                         "GL_OES_texture_storage_multisample_2d_array"), !bVar4)) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Test requires OES_texture_storage_multisample_2d_array extension",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
               ,0xa7);
LAB_01283e4d:
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  if ((pRVar10->m_width < 1) ||
     (pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context), pRVar10->m_height < 1))
  {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"rendertarget size must be at least 1x1",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
               ,0xaa);
    goto LAB_01283e4d;
  }
  maxTextureSize = 0;
  maxTextureLayers = 0;
  maxSamples = 0;
  (**(code **)(lVar14 + 0x868))(0xd33);
  (**(code **)(lVar14 + 0x868))(0x88ff,&maxTextureLayers);
  pcVar2 = *(code **)(lVar14 + 0x880);
  GVar7 = getTextureGLTarget(this);
  GVar8 = getTextureGLInternalFormat(this);
  (*pcVar2)(GVar7,GVar8,0x80a9,1,&maxSamples);
  if (maxSamples < this->m_numSamples) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"sample count is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
               ,0xb5);
    goto LAB_01283e4d;
  }
  this_00 = (ShaderProgram *)operator_new(0xd0);
  pCVar3 = (this->super_TestCase).m_context;
  renderCtx = pCVar3->m_renderCtx;
  memset(local_1b0,0,0xac);
  local_100 = (pointer)0x0;
  uStack_f8 = 0;
  uStack_f7 = 0;
  uStack_f0 = 0;
  uStack_ef = 0;
  CVar6.super_ApiType.m_bits = (ApiType)(*pCVar3->m_renderCtx->_vptr_RenderContext[2])();
  GVar9 = glu::getContextTypeGLSLVersion(CVar6);
  p_Var1 = &specializationMap._M_t._M_impl.super__Rb_tree_header;
  specializationMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  specializationMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  specializationMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  specializationMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  specializationMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  glu::getGLSLVersionDeclaration(GVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_248,"GLSL_VERSION_DECL",(allocator<char> *)&sStack_2c8);
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&specializationMap,(key_type *)local_248);
  std::__cxx11::string::assign((char *)pmVar11);
  std::__cxx11::string::~string((string *)local_248);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_2c8,
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,(allocator<char> *)&local_268);
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_248,&sStack_2c8);
  tcu::StringTemplate::specialize(&local_1f8,(StringTemplate *)local_248,&specializationMap);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_248);
  std::__cxx11::string::~string((string *)&sStack_2c8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&specializationMap._M_t);
  glu::VertexSource::VertexSource((VertexSource *)local_1d8,&local_1f8);
  pPVar12 = glu::ProgramSources::operator<<((ProgramSources *)local_1b0,(ShaderSource *)local_1d8);
  specializationMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  specializationMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  specializationMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  specializationMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  specializationMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  switch(this->m_type) {
  case TEXTURE_FLOAT_2D:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_2c8,"SAMPLERTYPE",(allocator<char> *)&local_268);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&specializationMap,&sStack_2c8);
    std::__cxx11::string::assign((char *)pmVar11);
    break;
  case TEXTURE_FLOAT_2D_ARRAY:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_2c8,"SAMPLERTYPE",(allocator<char> *)&local_268);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&specializationMap,&sStack_2c8);
    std::__cxx11::string::assign((char *)pmVar11);
    break;
  case TEXTURE_INT_2D:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_2c8,"SAMPLERTYPE",(allocator<char> *)&local_268);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&specializationMap,&sStack_2c8);
    std::__cxx11::string::assign((char *)pmVar11);
    break;
  case TEXTURE_INT_2D_ARRAY:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_2c8,"SAMPLERTYPE",(allocator<char> *)&local_268);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&specializationMap,&sStack_2c8);
    std::__cxx11::string::assign((char *)pmVar11);
    break;
  case TEXTURE_UINT_2D:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_2c8,"SAMPLERTYPE",(allocator<char> *)&local_268);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&specializationMap,&sStack_2c8);
    std::__cxx11::string::assign((char *)pmVar11);
    break;
  case TEXTURE_UINT_2D_ARRAY:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_2c8,"SAMPLERTYPE",(allocator<char> *)&local_268);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&specializationMap,&sStack_2c8);
    std::__cxx11::string::assign((char *)pmVar11);
    break;
  default:
    goto switchD_0128371a_default;
  }
  std::__cxx11::string::~string((string *)&sStack_2c8);
switchD_0128371a_default:
  if (this->m_isArrayType == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_2c8,"SIZETYPE",(allocator<char> *)&local_268);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&specializationMap,&sStack_2c8);
    std::__cxx11::string::assign((char *)pmVar11);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_2c8,"SIZETYPE",(allocator<char> *)&local_268);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&specializationMap,&sStack_2c8);
    std::__cxx11::string::assign((char *)pmVar11);
  }
  std::__cxx11::string::~string((string *)&sStack_2c8);
  CVar6.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar4 = glu::contextSupports(CVar6,(ApiType)0x23);
  if (bVar4 || this->m_isArrayType != true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_2c8,"EXTENSION_STATEMENT",(allocator<char> *)&local_268);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&specializationMap,&sStack_2c8);
    std::__cxx11::string::assign((char *)pmVar11);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_2c8,"EXTENSION_STATEMENT",(allocator<char> *)&local_268);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&specializationMap,&sStack_2c8);
    std::__cxx11::string::assign((char *)pmVar11);
  }
  std::__cxx11::string::~string((string *)&sStack_2c8);
  GVar9 = glu::getContextTypeGLSLVersion(CVar6);
  glu::getGLSLVersionDeclaration(GVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_2c8,"GLSL_VERSION_DECL",(allocator<char> *)&local_268);
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&specializationMap,&sStack_2c8);
  std::__cxx11::string::assign((char *)pmVar11);
  std::__cxx11::string::~string((string *)&sStack_2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,
             "${GLSL_VERSION_DECL}\n${EXTENSION_STATEMENT}layout(location = 0) out highp vec4 fragColor;\nuniform highp ${SAMPLERTYPE} u_sampler;\nuniform highp ${SIZETYPE} u_size;\nvoid main (void)\n{\n\tconst highp vec4 okColor = vec4(0.0, 1.0, 0.0, 1.0);\n\tconst highp vec4 failColor = vec4(1.0, 0.0, 0.0, 1.0);\n\tfragColor = (textureSize(u_sampler) == u_size) ? (okColor) : (failColor);\n}\n"
             ,&local_29d);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&sStack_2c8,&local_268);
  tcu::StringTemplate::specialize(&local_218,(StringTemplate *)&sStack_2c8,&specializationMap);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&sStack_2c8);
  std::__cxx11::string::~string((string *)&local_268);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&specializationMap._M_t);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_248,&local_218);
  pPVar12 = glu::ProgramSources::operator<<(pPVar12,(ShaderSource *)local_248);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,pPVar12);
  this->m_shader = this_00;
  std::__cxx11::string::~string((string *)(local_248 + 8));
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)(local_1d8 + 8));
  std::__cxx11::string::~string((string *)&local_1f8);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_1b0);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_shader);
  if ((this->m_shader->m_program).m_info.linkOk == false) {
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"shader build failed",(allocator<char> *)&specializationMap);
    tcu::TestError::TestError(this_02,(string *)local_1b0);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar14 + 0x6c8))(1,&this->m_vbo);
  (**(code **)(lVar14 + 0x40))(0x8892,this->m_vbo);
  (**(code **)(lVar14 + 0x150))(0x8892,0x40,init::fullscreenQuad,0x88e4);
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::operator<<((ostream *)&local_1a8,"GL_MAX_TEXTURE_SIZE = ");
  std::ostream::operator<<((ostringstream *)&local_1a8,maxTextureSize);
  std::operator<<((ostream *)&local_1a8,"\n");
  std::operator<<((ostream *)&local_1a8,"GL_MAX_ARRAY_TEXTURE_LAYERS = ");
  std::ostream::operator<<((ostringstream *)&local_1a8,maxTextureLayers);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  pvVar13 = (reference)std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  if (this->m_isArrayType == false) {
    for (lVar14 = 0; iVar5 = (int)pvVar13, lVar14 != 7; lVar14 = lVar14 + 1) {
      local_1b0._0_4_ = init::testSizes2D[lVar14].m_data[0];
      pvVar13 = (reference)(ulong)(uint)local_1b0._0_4_;
      if (((int)local_1b0._0_4_ <= maxTextureSize) &&
         (local_1b0._4_4_ = init::testSizes2D[lVar14].m_data[1],
         (int)local_1b0._4_4_ <= maxTextureSize)) {
        if ((int)local_1b0._0_4_ < 0) {
          local_1b0._0_4_ = maxTextureSize;
        }
        if ((int)local_1b0._4_4_ < 0) {
          local_1b0._4_4_ = maxTextureSize;
        }
        local_1a8 = 0;
        pvVar13 = std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
                  emplace_back<tcu::Vector<int,3>>
                            ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)
                             &this->m_iterations,(Vector<int,_3> *)local_1b0);
      }
    }
  }
  else {
    for (lVar14 = 8; iVar5 = (int)pvVar13, lVar14 != 0x68; lVar14 = lVar14 + 0xc) {
      local_1b0._0_4_ =
           *(undefined4 *)
            (&Functional::(anonymous_namespace)::TextureSizeCase::init()::testSizes2D + lVar14);
      pvVar13 = (reference)(ulong)(uint)local_1b0._0_4_;
      if ((((int)local_1b0._0_4_ <= maxTextureSize) &&
          (local_1b0._4_4_ = *(int *)(lVar14 + 0x1f55bfc), (int)local_1b0._4_4_ <= maxTextureSize))
         && (iVar5 = *(int *)((long)init::testSizes3D[0].m_data + lVar14), iVar5 <= maxTextureLayers
            )) {
        if ((int)local_1b0._0_4_ < 0) {
          local_1b0._0_4_ = maxTextureSize;
        }
        if ((int)local_1b0._4_4_ < 0) {
          local_1b0._4_4_ = maxTextureSize;
        }
        local_1a8 = maxTextureLayers;
        if (-1 < iVar5) {
          local_1a8 = iVar5;
        }
        pvVar13 = std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
                  emplace_back<tcu::Vector<int,3>>
                            ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)
                             &this->m_iterations,(Vector<int,_3> *)local_1b0);
      }
    }
  }
  return iVar5;
}

Assistant:

void TextureSizeCase::init (void)
{
	static const tcu::IVec2 testSizes2D[] =
	{
		tcu::IVec2(1,	1),
		tcu::IVec2(1,	4),
		tcu::IVec2(4,	8),
		tcu::IVec2(21,	11),
		tcu::IVec2(107,	254),
		tcu::IVec2(-1,	3),
		tcu::IVec2(3,	-1),
	};
	static const tcu::IVec3 testSizes3D[] =
	{
		tcu::IVec3(1,	1,		1),
		tcu::IVec3(1,	4,		7),
		tcu::IVec3(4,	8,		12),
		tcu::IVec3(21,	11,		9),
		tcu::IVec3(107,	254,	2),
		tcu::IVec3(-1,	3,		3),
		tcu::IVec3(3,	-1,		3),
		tcu::IVec3(4,	4,		-1),
	};
	static const tcu::Vec4 fullscreenQuad[] =
	{
		tcu::Vec4(-1.0f,  1.0f, 0.0f, 1.0f),
		tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
		tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f),
		tcu::Vec4( 1.0f, -1.0f, 0.0f, 1.0f)
	};

	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const bool				supportsES32		= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	// requirements
	if (m_isArrayType && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
		TCU_THROW(NotSupportedError, "Test requires OES_texture_storage_multisample_2d_array extension");

	if (m_context.getRenderTarget().getWidth() < 1 || m_context.getRenderTarget().getHeight() < 1)
		TCU_THROW(NotSupportedError, "rendertarget size must be at least 1x1");

	glw::GLint				maxTextureSize		= 0;
	glw::GLint				maxTextureLayers	= 0;
	glw::GLint				maxSamples			= 0;

	gl.getIntegerv(GL_MAX_TEXTURE_SIZE, &maxTextureSize);
	gl.getIntegerv(GL_MAX_ARRAY_TEXTURE_LAYERS, &maxTextureLayers);
	gl.getInternalformativ(getTextureGLTarget(), getTextureGLInternalFormat(), GL_SAMPLES, 1, &maxSamples);

	if (m_numSamples > maxSamples)
		TCU_THROW(NotSupportedError, "sample count is not supported");

	// gen shade

	m_shader = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(specializeShader(m_context, s_positionVertexShaderSource)) << glu::FragmentSource(genFragmentSource()));
	m_testCtx.getLog() << *m_shader;
	if (!m_shader->isOk())
		throw tcu::TestError("shader build failed");

	// gen buffer

	gl.genBuffers(1, &m_vbo);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_vbo);
	gl.bufferData(GL_ARRAY_BUFFER, sizeof(fullscreenQuad), fullscreenQuad, GL_STATIC_DRAW);

	// gen iterations

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "GL_MAX_TEXTURE_SIZE = " << maxTextureSize << "\n"
		<< "GL_MAX_ARRAY_TEXTURE_LAYERS = " << maxTextureLayers
		<< tcu::TestLog::EndMessage;

	if (!m_isArrayType)
	{
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(testSizes2D); ++ndx)
		{
			if (testSizes2D[ndx].x() <= maxTextureSize && testSizes2D[ndx].y() <= maxTextureSize)
			{
				const int w = (testSizes2D[ndx].x() < 0) ? (maxTextureSize) : (testSizes2D[ndx].x());
				const int h = (testSizes2D[ndx].y() < 0) ? (maxTextureSize) : (testSizes2D[ndx].y());

				m_iterations.push_back(tcu::IVec3(w, h, 0));
			}
		}
	}
	else
	{
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(testSizes3D); ++ndx)
		{
			if (testSizes3D[ndx].x() <= maxTextureSize && testSizes3D[ndx].y() <= maxTextureSize && testSizes3D[ndx].z() <= maxTextureLayers)
			{
				const int w = (testSizes3D[ndx].x() < 0) ? (maxTextureSize)		: (testSizes3D[ndx].x());
				const int h = (testSizes3D[ndx].y() < 0) ? (maxTextureSize)		: (testSizes3D[ndx].y());
				const int d = (testSizes3D[ndx].z() < 0) ? (maxTextureLayers)	: (testSizes3D[ndx].z());

				m_iterations.push_back(tcu::IVec3(w, h, d));
			}
		}
	}
}